

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test::
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test
          (TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter =
       (MemoryLeakFailureForTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator =
       (AllocatorForMemoryLeakDetectionTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector = (MemoryLeakDetector *)0x0;
  TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest::TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest
            (&this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_0035e8b0;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, AllocOneTypeFreeAnotherTypeWithCheckingDisabled)
{
    detector->disableAllocationTypeChecking();
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 100, "ALLOC.c", 10);
    detector->deallocMemory(defaultNewAllocator(), mem, "FREE.c", 100);
    detector->stopChecking();
    STRCMP_EQUAL("", reporter->message->asCharString());
    detector->enableAllocationTypeChecking();
}